

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  pointer pcVar1;
  TestPartResultArray *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  char local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  HasOneFailure(local_18,in_RSI,in_RDX,in_RCX,(Type)this->results_,(string *)(ulong)this->type_);
  if (local_18[0] == '\0') {
    Message::Message((Message *)&local_20);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/gtest-all.cc"
               ,0x848,message);
    AssertHelper::operator=(&local_28,(Message *)&local_20);
    AssertHelper::~AssertHelper(&local_28);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20.ptr_ + 8))();
    }
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (this->substr_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->substr_).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}